

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O3

ans_int_decode * ans_int_decode::load(ans_int_decode *__return_storage_ptr__,uint8_t *in_u8)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  uint *puVar5;
  pointer puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  pointer puVar12;
  uint64_t uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint *puVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  ushort uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 extraout_var [56];
  undefined1 auVar31 [64];
  undefined1 in_XMM7 [16];
  undefined1 local_38 [16];
  pointer local_28;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ans_load_interp((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,in_u8);
  puVar12 = local_28;
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_28 = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_38._0_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_38._8_8_;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar12;
  local_38 = (undefined1  [16])0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    if ((pointer)local_38._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_38._0_8_,(long)local_28 - local_38._0_8_);
    }
  }
  puVar4 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar14 = puVar4 + 1;
  puVar18 = puVar4;
  if (puVar14 != puVar5 && puVar4 != puVar5) {
    uVar19 = *puVar4;
    do {
      uVar20 = *puVar14;
      bVar23 = uVar19 < uVar20;
      if (uVar19 <= uVar20) {
        uVar19 = uVar20;
      }
      if (bVar23) {
        puVar18 = puVar14;
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar5);
  }
  uVar19 = *puVar18;
  if (puVar4 == puVar5) {
    uVar13 = 0;
  }
  else {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    uVar15 = 0;
    auVar28 = vpbroadcastq_avx512f();
    auVar28 = vpsrlq_avx512f(auVar28,2);
    do {
      auVar29 = vpbroadcastq_avx512f();
      auVar30 = vmovdqa64_avx512f(auVar31);
      auVar31 = vporq_avx512f(auVar29,auVar26);
      auVar29 = vporq_avx512f(auVar29,auVar27);
      uVar9 = vpcmpuq_avx512f(auVar29,auVar28,2);
      bVar10 = (byte)uVar9;
      uVar9 = vpcmpuq_avx512f(auVar31,auVar28,2);
      bVar11 = (byte)uVar9;
      uVar24 = CONCAT11(bVar11,bVar10);
      auVar31 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar4 + uVar15));
      auVar29._4_4_ = (uint)((byte)(uVar24 >> 1) & 1) * auVar31._4_4_;
      auVar29._0_4_ = (uint)(bVar10 & 1) * auVar31._0_4_;
      auVar29._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar31._8_4_;
      auVar29._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar31._12_4_;
      auVar29._16_4_ = (uint)((byte)(uVar24 >> 4) & 1) * auVar31._16_4_;
      auVar29._20_4_ = (uint)((byte)(uVar24 >> 5) & 1) * auVar31._20_4_;
      auVar29._24_4_ = (uint)((byte)(uVar24 >> 6) & 1) * auVar31._24_4_;
      auVar29._28_4_ = (uint)((byte)(uVar24 >> 7) & 1) * auVar31._28_4_;
      auVar29._32_4_ = (uint)(bVar11 & 1) * auVar31._32_4_;
      auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar31._36_4_;
      auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar31._40_4_;
      auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar31._44_4_;
      auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar31._48_4_;
      auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar31._52_4_;
      auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar31._56_4_;
      auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar31._60_4_;
      uVar15 = uVar15 + 0x10;
      auVar31 = vpaddd_avx512f(auVar29,auVar30);
    } while ((((ulong)((long)puVar5 + (-4 - (long)puVar4)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar15);
    auVar26 = vmovdqa32_avx512f(auVar31);
    auVar27._0_4_ = (uint)(bVar10 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar30._0_4_;
    bVar23 = (bool)((byte)(uVar24 >> 1) & 1);
    auVar27._4_4_ = (uint)bVar23 * auVar26._4_4_ | (uint)!bVar23 * auVar30._4_4_;
    bVar23 = (bool)((byte)(uVar24 >> 2) & 1);
    auVar27._8_4_ = (uint)bVar23 * auVar26._8_4_ | (uint)!bVar23 * auVar30._8_4_;
    bVar23 = (bool)((byte)(uVar24 >> 3) & 1);
    auVar27._12_4_ = (uint)bVar23 * auVar26._12_4_ | (uint)!bVar23 * auVar30._12_4_;
    bVar23 = (bool)((byte)(uVar24 >> 4) & 1);
    auVar27._16_4_ = (uint)bVar23 * auVar26._16_4_ | (uint)!bVar23 * auVar30._16_4_;
    bVar23 = (bool)((byte)(uVar24 >> 5) & 1);
    auVar27._20_4_ = (uint)bVar23 * auVar26._20_4_ | (uint)!bVar23 * auVar30._20_4_;
    bVar23 = (bool)((byte)(uVar24 >> 6) & 1);
    auVar27._24_4_ = (uint)bVar23 * auVar26._24_4_ | (uint)!bVar23 * auVar30._24_4_;
    bVar23 = (bool)((byte)(uVar24 >> 7) & 1);
    auVar27._28_4_ = (uint)bVar23 * auVar26._28_4_ | (uint)!bVar23 * auVar30._28_4_;
    auVar27._32_4_ =
         (uint)(bVar11 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar30._32_4_;
    bVar23 = (bool)(bVar11 >> 1 & 1);
    auVar27._36_4_ = (uint)bVar23 * auVar26._36_4_ | (uint)!bVar23 * auVar30._36_4_;
    bVar23 = (bool)(bVar11 >> 2 & 1);
    auVar27._40_4_ = (uint)bVar23 * auVar26._40_4_ | (uint)!bVar23 * auVar30._40_4_;
    bVar23 = (bool)(bVar11 >> 3 & 1);
    auVar27._44_4_ = (uint)bVar23 * auVar26._44_4_ | (uint)!bVar23 * auVar30._44_4_;
    bVar23 = (bool)(bVar11 >> 4 & 1);
    auVar27._48_4_ = (uint)bVar23 * auVar26._48_4_ | (uint)!bVar23 * auVar30._48_4_;
    bVar23 = (bool)(bVar11 >> 5 & 1);
    auVar27._52_4_ = (uint)bVar23 * auVar26._52_4_ | (uint)!bVar23 * auVar30._52_4_;
    bVar23 = (bool)(bVar11 >> 6 & 1);
    auVar27._56_4_ = (uint)bVar23 * auVar26._56_4_ | (uint)!bVar23 * auVar30._56_4_;
    auVar27._60_4_ =
         (uint)(bVar11 >> 7) * auVar26._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar30._60_4_;
    auVar25 = vextracti64x4_avx512f(auVar27,1);
    auVar26 = vpaddd_avx512f(auVar27,ZEXT3264(auVar25));
    auVar7 = vpaddd_avx(auVar26._0_16_,auVar26._16_16_);
    auVar8 = vpshufd_avx(auVar7,0xee);
    auVar7 = vpaddd_avx(auVar7,auVar8);
    auVar8 = vpshufd_avx(auVar7,0x55);
    auVar7 = vpaddd_avx(auVar7,auVar8);
    uVar13 = (uint64_t)auVar7._0_4_;
  }
  auVar7 = vcvtusi2sd_avx512f(in_XMM7,uVar13);
  __return_storage_ptr__->frame_size = uVar13;
  __return_storage_ptr__->frame_mask = uVar13 - 1;
  auVar26._0_8_ = log2(auVar7._0_8_);
  auVar26._8_56_ = extraout_var;
  uVar13 = vcvttsd2usi_avx512f(auVar26._0_16_);
  __return_storage_ptr__->frame_log2 = uVar13;
  lVar22 = (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(__return_storage_ptr__->nfreqs).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  if (uVar19 < 0x10000) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size << 3);
    __return_storage_ptr__->table_type = SMALL;
    puVar6 = (__return_storage_ptr__->table).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = 0;
    lVar16 = 0;
    do {
      uVar19 = puVar2[lVar16];
      uVar20 = 0;
      if ((ulong)uVar19 != 0) {
        lVar1 = uVar15 * 8;
        uVar21 = 0;
        do {
          *(short *)(puVar6 + uVar21 * 8 + lVar1) = (short)uVar19;
          *(int *)(puVar6 + uVar21 * 8 + lVar1 + 4) = (int)lVar16;
          *(short *)(puVar6 + uVar21 * 8 + lVar1 + 2) = (short)uVar21;
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
        uVar20 = puVar2[lVar16];
      }
      uVar15 = (ulong)((int)uVar15 + uVar20);
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar22 + (ulong)(lVar22 == 0));
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&__return_storage_ptr__->table,__return_storage_ptr__->frame_size * 0xc);
    __return_storage_ptr__->table_type = LARGE;
    puVar2 = (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (__return_storage_ptr__->table).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = 0;
    iVar17 = 0;
    do {
      uVar19 = puVar2[lVar16];
      if ((ulong)uVar19 != 0) {
        uVar15 = 0;
        do {
          uVar21 = (ulong)(uint)(iVar17 + (int)uVar15);
          *(uint *)(puVar6 + uVar21 * 0xc) = uVar19;
          *(int *)(puVar6 + uVar21 * 0xc + 8) = (int)lVar16;
          *(int *)(puVar6 + uVar21 * 0xc + 4) = (int)uVar15;
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
        iVar17 = iVar17 + puVar2[lVar16];
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar22 + (ulong)(lVar22 == 0));
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_int_decode load(const uint8_t* in_u8)
    {
        ans_int_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        if (max_norm_freq <= std::numeric_limits<uint16_t>::max()) {
            model.table.resize(model.frame_size * sizeof(dec_entry_int_small));
            model.table_type = dec_table_type::SMALL;
            auto table
                = reinterpret_cast<dec_entry_int_small*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_int_small* entry = table + cur_base + k;
                    entry->freq = cur_freq;
                    entry->sym = sym;
                    entry->offset = k;
                }
                cur_base += model.nfreqs[sym];
            }
        } else {
            model.table.resize(model.frame_size * sizeof(dec_entry_int));
            model.table_type = dec_table_type::LARGE;
            auto table = reinterpret_cast<dec_entry_int*>(model.table.data());
            for (size_t sym = 0; sym <= max_sym; sym++) {
                auto cur_freq = model.nfreqs[sym];
                if (cur_freq == 0)
                    continue;
                for (uint32_t k = 0; k < cur_freq; k++) {
                    dec_entry_int* entry = table + cur_base + k;
                    table[cur_base + k].freq = cur_freq;
                    table[cur_base + k].sym = sym;
                    table[cur_base + k].offset = k;
                }
                dec_entry_int* entry = table + cur_base;
                cur_base += model.nfreqs[sym];
            }
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }